

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O0

bool __thiscall FMapInfoParser::CheckNumber(FMapInfoParser *this)

{
  bool bVar1;
  FMapInfoParser *this_local;
  
  if (this->format_type == 2) {
    bVar1 = FScanner::CheckString(&this->sc,",");
    if (bVar1) {
      FScanner::MustGetNumber(&this->sc);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = FScanner::CheckNumber(&this->sc);
  }
  return this_local._7_1_;
}

Assistant:

bool FMapInfoParser::CheckNumber()
{
	if (format_type == FMT_New) 
	{
		if (sc.CheckString(","))
		{
			sc.MustGetNumber();
			return true;
		}
		return false;
	}
	else return sc.CheckNumber();
}